

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void draw_round_arrow(Fl_Color c,float da)

{
  double dVar1;
  double dVar2;
  double ar_1;
  double ar;
  int j;
  int i;
  double dr2;
  double dr1;
  double r;
  double a;
  float da_local;
  Fl_Color c_local;
  
  for (ar._0_4_ = 0; (int)ar._0_4_ < 2; ar._0_4_ = ar._0_4_ + 1) {
    if ((ar._0_4_ & 1) == 0) {
      fl_color(c);
      fl_begin_complex_polygon();
    }
    else {
      fl_color(c);
      set_outline_color(c);
      fl_begin_loop();
    }
    fl_vertex(-0.1,0.0);
    fl_vertex(-1.0,0.0);
    fl_vertex(-1.0,0.9);
    r = 140.0;
    dr1 = 1.0;
    for (ar._4_4_ = 0x1b; 0 < ar._4_4_; ar._4_4_ = ar._4_4_ + -1) {
      dVar1 = (r / 180.0) * 3.141592653589793;
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      fl_vertex(dVar2 * dr1,dVar1 * dr1);
      r = r - (double)da;
      dr1 = dr1 - 0.005;
    }
    for (ar._4_4_ = 0x1b; -1 < ar._4_4_; ar._4_4_ = ar._4_4_ + -1) {
      dVar1 = (r / 180.0) * 3.141592653589793;
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      fl_vertex(dVar2 * dr1,dVar1 * dr1);
      r = (double)da + r;
      dr1 = dr1 - 0.015;
    }
    if ((ar._0_4_ & 1) == 0) {
      fl_end_complex_polygon();
    }
    else {
      fl_end_loop();
    }
  }
  return;
}

Assistant:

static void draw_round_arrow(Fl_Color c, float da=5.0) {
  double a, r, dr1=0.005, dr2=0.015;
  int i, j;
  for (j=0; j<2; j++) {
    if (j&1) {
      fl_color(c);
      set_outline_color(c);
      BC;
    } else {
      fl_color(c);
      BCP;
    }
    vv(-0.1, 0.0);
    vv(-1.0, 0.0);
    vv(-1.0, 0.9);
    for (i=27, a=140.0, r=1.0; i>0; i--, a-=da, r-=dr1) {
      double ar = a/180.0 * M_PI;
      vv(cos(ar)*r, sin(ar)*r);
    }
    for (i=27; i>=0; a+=da, i--, r-=dr2) {
      double ar = a/180.0 * M_PI;
      vv(cos(ar)*r, sin(ar)*r);
    }
    if (j&1) {
      EC;
    } else {
      ECP;
    }
  }
}